

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneratedSaxParserParserTemplate.h
# Opt level: O0

bool __thiscall
GeneratedSaxParser::
ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
::elementEnd(ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
             *this,ParserChar *elementName)

{
  bool bVar1;
  byte bVar2;
  reference pvVar3;
  reference pvVar4;
  pointer ppVar5;
  ulong uVar6;
  long *plVar7;
  StackMemoryManager *this_00;
  undefined8 in_RSI;
  long in_RDI;
  FunctionStruct *functions;
  const_iterator it;
  ElementFunctionMap *functionMapToUse;
  ElementData elementData;
  StringHashPair hashPair;
  map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
  *in_stack_ffffffffffffff58;
  deque<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
  *in_stack_ffffffffffffff60;
  code *pcVar8;
  deque<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
  *in_stack_ffffffffffffff70;
  code *local_88;
  _Self local_60;
  _Self local_58;
  long local_50;
  StringHash local_48;
  StringHash local_40;
  size_t local_38;
  void *local_30;
  StringHashPair local_28;
  undefined8 local_18;
  bool local_1;
  
  local_18 = in_RSI;
  bVar1 = std::
          stack<GeneratedSaxParser::NamespaceStackFrame,_std::deque<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>_>
          ::empty((stack<GeneratedSaxParser::NamespaceStackFrame,_std::deque<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>_>
                   *)0xa85390);
  if (!bVar1) {
    pvVar3 = std::
             stack<GeneratedSaxParser::NamespaceStackFrame,_std::deque<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>_>
             ::top((stack<GeneratedSaxParser::NamespaceStackFrame,_std::deque<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>_>
                    *)0xa853a5);
    pvVar3->counter = pvVar3->counter - 1;
    pvVar3 = std::
             stack<GeneratedSaxParser::NamespaceStackFrame,_std::deque<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>_>
             ::top((stack<GeneratedSaxParser::NamespaceStackFrame,_std::deque<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>_>
                    *)0xa853c2);
    if (pvVar3->counter == 0) {
      std::
      stack<GeneratedSaxParser::NamespaceStackFrame,_std::deque<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>_>
      ::pop((stack<GeneratedSaxParser::NamespaceStackFrame,_std::deque<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>_>
             *)0xa853da);
    }
  }
  if (*(long *)(in_RDI + 0x1d8) == 0) {
    if (*(long *)(in_RDI + 0x1e0) == 0) {
      if (*(long *)(in_RDI + 0x1e8) == 0) {
        bVar1 = std::
                deque<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
                ::empty((deque<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
                         *)0xa854fc);
        if (bVar1) {
          local_1 = false;
        }
        else {
          pvVar4 = std::
                   deque<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
                   ::back(in_stack_ffffffffffffff70);
          local_48 = pvVar4->elementHash;
          local_40 = pvVar4->generatedElementHash;
          local_38 = pvVar4->typeID;
          local_30 = pvVar4->validationData;
          if (*(long *)(in_RDI + 0x100) == 0) {
            local_50 = in_RDI + 0xd0;
          }
          else {
            local_50 = *(long *)(in_RDI + 0x100);
          }
          local_58._M_node =
               (_Base_ptr)
               std::
               map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
               ::find(in_stack_ffffffffffffff58,(key_type *)0xa85588);
          local_60._M_node =
               (_Base_ptr)
               std::
               map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
               ::end(in_stack_ffffffffffffff58);
          bVar1 = std::operator==(&local_58,&local_60);
          if (bVar1) {
            std::
            deque<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
            ::pop_back(in_stack_ffffffffffffff60);
            local_1 = false;
          }
          else {
            ppVar5 = std::
                     _Rb_tree_const_iterator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>
                     ::operator->((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>
                                   *)0xa855d6);
            if ((ppVar5->second).validateEndFunction != 0) {
              local_88 = (code *)(ppVar5->second).validateEndFunction;
              plVar7 = (long *)(in_RDI + *(long *)&(ppVar5->second).field_0x48);
              if (((ulong)local_88 & 1) != 0) {
                local_88 = *(code **)(local_88 + *plVar7 + -1);
              }
              uVar6 = (*local_88)(plVar7);
              if ((uVar6 & 1) != 0) {
                std::
                deque<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
                ::pop_back(in_stack_ffffffffffffff60);
                if ((ppVar5->second).endFunction != 0) {
                  pcVar8 = (code *)(ppVar5->second).endFunction;
                  this_00 = (StackMemoryManager *)(in_RDI + *(long *)&(ppVar5->second).field_0x28);
                  if (((ulong)pcVar8 & 1) != 0) {
                    pcVar8 = *(code **)(pcVar8 + (this_00->mActiveFrame - 1));
                  }
                  uVar6 = (*pcVar8)(this_00);
                  if ((uVar6 & 1) != 0) {
                    if (local_30 != (void *)0x0) {
                      StackMemoryManager::deleteObject(this_00);
                    }
                    return true;
                  }
                }
                return false;
              }
            }
            std::
            deque<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
            ::pop_back(in_stack_ffffffffffffff60);
            local_1 = false;
          }
        }
      }
      else {
        *(long *)(in_RDI + 0x1e8) = *(long *)(in_RDI + 0x1e8) + -1;
        local_28 = Utils::calculateStringHashWithNamespace((ParserChar *)in_stack_ffffffffffffff70);
        bVar2 = (**(code **)(**(long **)(in_RDI + 0x148) + 0x18))
                          (*(long **)(in_RDI + 0x148),&local_28.second,local_18);
        local_1 = (bool)(bVar2 & 1);
      }
    }
    else {
      *(long *)(in_RDI + 0x1e0) = *(long *)(in_RDI + 0x1e0) + -1;
      if (*(long *)(in_RDI + 0x110) == 0) {
        local_1 = true;
      }
      else {
        bVar2 = (**(code **)(**(long **)(in_RDI + 0x110) + 0x18))
                          (*(long **)(in_RDI + 0x110),local_18);
        local_1 = (bool)(bVar2 & 1);
      }
    }
  }
  else {
    *(long *)(in_RDI + 0x1d8) = *(long *)(in_RDI + 0x1d8) + -1;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool ParserTemplate<DerivedClass, ImplClass>::elementEnd(const ParserChar* elementName)
	{
        if ( !mNamespacesStack.empty() )
        {
            mNamespacesStack.top().counter--;
            if ( mNamespacesStack.top().counter == 0 )
            {
                mNamespacesStack.pop();
            }
        }
        if ( mIgnoreElements > 0 )
        {
            mIgnoreElements--;
            return true;
        }
        if ( mUnknownElements > 0 )
        {
            mUnknownElements--;
            if ( mUnknownHandler != 0 )
            {
                return mUnknownHandler->elementEnd( elementName );
            }
            else
            {
                return true;
            }
        }
        if ( mNamespaceElements > 0 )
        {
            mNamespaceElements--;
            StringHashPair hashPair = Utils::calculateStringHashWithNamespace( elementName );
            return mActiveNamespaceHandler->elementEnd( hashPair.second, elementName );
        }

        if ( mElementDataStack.empty() )
            return false;
        ElementData elementData = mElementDataStack.back();

        const ElementFunctionMap* functionMapToUse;
        if ( mCurrentElementFunctionMap )
            functionMapToUse = mCurrentElementFunctionMap;
        else
            functionMapToUse = &mElementFunctionMap;
        typename ElementFunctionMap::const_iterator it = functionMapToUse->find(elementData.generatedElementHash);
		if ( it == functionMapToUse->end() )
        {
            mElementDataStack.pop_back();
			return false;
        }
		const FunctionStruct& functions = it->second;

		if ( !functions.validateEndFunction || !(static_cast<DerivedClass*>(this)->*functions.validateEndFunction)())
        {
            mElementDataStack.pop_back();
			return false;
        }

        mElementDataStack.pop_back();

        if ( !functions.endFunction || !(static_cast<DerivedClass*>(this)->*functions.endFunction)() )
			return false;

		if ( elementData.validationData )
			mStackMemoryManager.deleteObject(); // validation data

		return true;
	}